

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O2

void do_cmd_pathfind(command *cmd)

{
  loc start;
  player_upkeep *ppVar1;
  player *ppVar2;
  wchar_t wVar3;
  loc grid;
  loc local_10;
  
  cmd_get_arg_point((command_conflict *)cmd,"point",&local_10);
  if (player->timed[4] == 0) {
    if (player->upkeep->steps != (int16_t *)0x0) {
      __assert_fail("!player->upkeep->steps",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/cmd-cave.c"
                    ,0x63b,"void do_cmd_pathfind(struct command *)");
    }
    start.x = (player->grid).x;
    start.y = (player->grid).y;
    wVar3 = find_path(player,start,local_10,&player->upkeep->steps);
    ppVar2 = player;
    ppVar1 = player->upkeep;
    ppVar1->step_count = wVar3;
    if (L'\0' < wVar3) {
      (ppVar1->path_dest).x = local_10.x;
      (ppVar1->path_dest).y = local_10.y;
      ppVar1 = ppVar2->upkeep;
      ppVar1->running = ppVar1->step_count;
      *(byte *)&ppVar1->update = (byte)ppVar1->update | 2;
      run_step(L'\0');
    }
  }
  return;
}

Assistant:

void do_cmd_pathfind(struct command *cmd)
{
	struct loc grid;

	/* XXX-AS Add better arg checking */
	cmd_get_arg_point(cmd, "point", &grid);

	if (player->timed[TMD_CONFUSED])
		return;

	assert(!player->upkeep->steps);
	player->upkeep->step_count =
		find_path(player, player->grid, grid, &player->upkeep->steps);
	if (player->upkeep->step_count > 0) {
		player->upkeep->path_dest = grid;
		player->upkeep->running = player->upkeep->step_count;
		/* Calculate torch radius */
		player->upkeep->update |= (PU_TORCH);
		run_step(0);
	}
}